

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<myEmployee>::_create<myEmployee>(ChClassRegistration<myEmployee> *this)

{
  myEmployee *this_00;
  allocator local_31;
  string local_30;
  
  this_00 = (myEmployee *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_30,"John",&local_31);
  myEmployee::myEmployee(this_00,0x12,1020.3,ATHLETIC,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this_00;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }